

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yuv_rgb.c
# Opt level: O2

void yuv420_rgb24_std(uint32_t width,uint32_t height,uint8_t *Y,uint8_t *U,uint8_t *V,
                     uint32_t Y_stride,uint32_t UV_stride,uint8_t *RGB,uint32_t RGB_stride,
                     YCbCrType yuv_type)

{
  uint8_t uVar1;
  byte bVar2;
  byte bVar3;
  uint8_t uVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  uint uVar16;
  int iVar17;
  int iVar18;
  uint uVar19;
  uint8_t *puVar20;
  int iVar21;
  
  uVar12 = (ulong)yuv_type;
  iVar9 = RGB_stride * 2;
  iVar8 = Y_stride * 2;
  uVar13 = 0;
  uVar19 = 0;
  for (uVar16 = 0; uVar16 < height - 1; uVar16 = uVar16 + 2) {
    uVar15 = (ulong)((uVar16 >> 1) * UV_stride);
    puVar20 = RGB;
    for (lVar14 = 0; (uint)lVar14 < width - 1; lVar14 = lVar14 + 2) {
      uVar1 = V[uVar15];
      bVar2 = YUV2RGB[uVar12].y_factor;
      bVar3 = YUV2RGB[uVar12].y_offset;
      iVar10 = (int)(((uint)Y[lVar14 + uVar13] - (uint)bVar3) * (uint)bVar2) >> 7;
      iVar21 = (int)((uint)YUV2RGB[uVar12].cr_factor * ((int)(char)uVar1 ^ 0xffffff80U)) >> 6;
      iVar18 = iVar10 + iVar21;
      if (0xfe < (short)iVar18) {
        iVar18 = 0xff;
      }
      if ((short)iVar18 < 1) {
        iVar18 = 0;
      }
      uVar4 = U[uVar15];
      bVar5 = YUV2RGB[uVar12].cb_factor;
      bVar6 = YUV2RGB[uVar12].g_cb_factor;
      bVar7 = YUV2RGB[uVar12].g_cr_factor;
      puVar20[uVar19] = (uint8_t)iVar18;
      iVar18 = (int)((uint)bVar7 * ((int)(char)uVar1 ^ 0xffffff80U) +
                    (uint)bVar6 * ((int)(char)uVar4 ^ 0xffffff80U)) >> 7;
      iVar17 = iVar10 - iVar18;
      if (0xfe < (short)iVar17) {
        iVar17 = 0xff;
      }
      if ((short)iVar17 < 1) {
        iVar17 = 0;
      }
      puVar20[(ulong)uVar19 + 1] = (uint8_t)iVar17;
      iVar17 = (int)((uint)bVar5 * ((int)(char)uVar4 ^ 0xffffff80U)) >> 6;
      iVar10 = iVar10 + iVar17;
      if (0xfe < (short)iVar10) {
        iVar10 = 0xff;
      }
      if ((short)iVar10 < 1) {
        iVar10 = 0;
      }
      puVar20[(ulong)uVar19 + 2] = (uint8_t)iVar10;
      iVar11 = (int)(((uint)Y[lVar14 + uVar13 + 1] - (uint)bVar3) * (uint)bVar2) >> 7;
      iVar10 = iVar11 + iVar21;
      if (0xfe < (short)iVar10) {
        iVar10 = 0xff;
      }
      if ((short)iVar10 < 1) {
        iVar10 = 0;
      }
      puVar20[(ulong)uVar19 + 3] = (uint8_t)iVar10;
      iVar10 = iVar11 - iVar18;
      if (0xfe < (short)iVar10) {
        iVar10 = 0xff;
      }
      if ((short)iVar10 < 1) {
        iVar10 = 0;
      }
      puVar20[(ulong)uVar19 + 4] = (uint8_t)iVar10;
      iVar11 = iVar11 + iVar17;
      if (0xfe < (short)iVar11) {
        iVar11 = 0xff;
      }
      if ((short)iVar11 < 1) {
        iVar11 = 0;
      }
      puVar20[(ulong)uVar19 + 5] = (uint8_t)iVar11;
      iVar11 = (int)(((uint)Y[lVar14 + (ulong)Y_stride] - (uint)bVar3) * (uint)bVar2) >> 7;
      iVar10 = iVar11 + iVar21;
      if (0xfe < (short)iVar10) {
        iVar10 = 0xff;
      }
      if ((short)iVar10 < 1) {
        iVar10 = 0;
      }
      puVar20[RGB_stride] = (uint8_t)iVar10;
      iVar10 = iVar11 - iVar18;
      if (0xfe < (short)iVar10) {
        iVar10 = 0xff;
      }
      if ((short)iVar10 < 1) {
        iVar10 = 0;
      }
      puVar20[(ulong)RGB_stride + 1] = (uint8_t)iVar10;
      iVar11 = iVar11 + iVar17;
      if (0xfe < (short)iVar11) {
        iVar11 = 0xff;
      }
      if ((short)iVar11 < 1) {
        iVar11 = 0;
      }
      puVar20[(ulong)RGB_stride + 2] = (uint8_t)iVar11;
      iVar10 = (int)(((uint)Y[lVar14 + (ulong)Y_stride + 1] - (uint)bVar3) * (uint)bVar2) >> 7;
      iVar21 = iVar21 + iVar10;
      if (0xfe < (short)iVar21) {
        iVar21 = 0xff;
      }
      if ((short)iVar21 < 1) {
        iVar21 = 0;
      }
      puVar20[(ulong)RGB_stride + 3] = (uint8_t)iVar21;
      iVar18 = iVar10 - iVar18;
      if (0xfe < (short)iVar18) {
        iVar18 = 0xff;
      }
      if ((short)iVar18 < 1) {
        iVar18 = 0;
      }
      puVar20[(ulong)RGB_stride + 4] = (uint8_t)iVar18;
      iVar10 = iVar10 + iVar17;
      if (0xfe < (short)iVar10) {
        iVar10 = 0xff;
      }
      if ((short)iVar10 < 1) {
        iVar10 = 0;
      }
      puVar20[(ulong)RGB_stride + 5] = (uint8_t)iVar10;
      puVar20 = puVar20 + 6;
      uVar15 = uVar15 + 1;
    }
    uVar19 = uVar19 + iVar9;
    RGB_stride = RGB_stride + iVar9;
    Y_stride = Y_stride + iVar8;
    uVar13 = (ulong)(uint)((int)uVar13 + iVar8);
  }
  return;
}

Assistant:

void yuv420_rgb24_std(
	uint32_t width, uint32_t height, 
	const uint8_t *Y, const uint8_t *U, const uint8_t *V, uint32_t Y_stride, uint32_t UV_stride, 
	uint8_t *RGB, uint32_t RGB_stride, 
	YCbCrType yuv_type)
{
	const YUV2RGBParam *const param = &(YUV2RGB[yuv_type]);
	uint32_t x, y;
	for(y=0; y<(height-1); y+=2)
	{
		const uint8_t *y_ptr1=Y+y*Y_stride,
			*y_ptr2=Y+(y+1)*Y_stride,
			*u_ptr=U+(y/2)*UV_stride,
			*v_ptr=V+(y/2)*UV_stride;
		
		uint8_t *rgb_ptr1=RGB+y*RGB_stride,
			*rgb_ptr2=RGB+(y+1)*RGB_stride;
		
		for(x=0; x<(width-1); x+=2)
		{
			int8_t u_tmp, v_tmp;
			u_tmp = u_ptr[0]-128;
			v_tmp = v_ptr[0]-128;
			
			//compute Cb Cr color offsets, common to four pixels
			int16_t b_cb_offset, r_cr_offset, g_cbcr_offset;
			b_cb_offset = (param->cb_factor*u_tmp)>>6;
			r_cr_offset = (param->cr_factor*v_tmp)>>6;
			g_cbcr_offset = (param->g_cb_factor*u_tmp + param->g_cr_factor*v_tmp)>>7;
			
			int16_t y_tmp;
			y_tmp = (param->y_factor*(y_ptr1[0]-param->y_offset))>>7;
			rgb_ptr1[0] = clamp(y_tmp + r_cr_offset);
			rgb_ptr1[1] = clamp(y_tmp - g_cbcr_offset);
			rgb_ptr1[2] = clamp(y_tmp + b_cb_offset);
			
			y_tmp = (param->y_factor*(y_ptr1[1]-param->y_offset))>>7;
			rgb_ptr1[3] = clamp(y_tmp + r_cr_offset);
			rgb_ptr1[4] = clamp(y_tmp - g_cbcr_offset);
			rgb_ptr1[5] = clamp(y_tmp + b_cb_offset);
			
			y_tmp = (param->y_factor*(y_ptr2[0]-param->y_offset))>>7;
			rgb_ptr2[0] = clamp(y_tmp + r_cr_offset);
			rgb_ptr2[1] = clamp(y_tmp - g_cbcr_offset);
			rgb_ptr2[2] = clamp(y_tmp + b_cb_offset);
			
			y_tmp = (param->y_factor*(y_ptr2[1]-param->y_offset))>>7;
			rgb_ptr2[3] = clamp(y_tmp + r_cr_offset);
			rgb_ptr2[4] = clamp(y_tmp - g_cbcr_offset);
			rgb_ptr2[5] = clamp(y_tmp + b_cb_offset);
			
			rgb_ptr1 += 6;
			rgb_ptr2 += 6;
			y_ptr1 += 2;
			y_ptr2 += 2;
			u_ptr += 1;
			v_ptr += 1;
		}
	}
}